

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O1

REF_STATUS ref_validation_boundary_face(REF_GRID ref_grid)

{
  REF_CELL pRVar1;
  REF_INT *pRVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  uint unaff_R13D;
  int iVar6;
  ulong uVar7;
  REF_BOOL has_face;
  REF_INT nodes [4];
  
  pRVar1 = ref_grid->cell[3];
  if (pRVar1->max < 1) {
    bVar3 = 0;
  }
  else {
    uVar7 = 0;
    bVar3 = 0;
    do {
      pRVar2 = pRVar1->c2n;
      iVar6 = (int)uVar7;
      if (pRVar2[(long)pRVar1->size_per * (long)iVar6] != -1) {
        lVar5 = 0;
        do {
          nodes[lVar5] = pRVar2[(long)pRVar1->size_per * (long)iVar6 + lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        nodes[3] = nodes[0];
        uVar4 = ref_grid_cell_has_face(ref_grid,nodes,&has_face);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0xb8,"ref_validation_boundary_face",(ulong)uVar4,"has_face");
          return uVar4;
        }
        if (has_face == 0) {
          printf("triangle %d nodes %d %d %d global %ld %ld %ld\n",uVar7);
          uVar4 = ref_node_location(ref_grid->node,nodes[0]);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0xc1,"ref_validation_boundary_face",(ulong)uVar4,"n0");
            return uVar4;
          }
          uVar4 = ref_node_location(ref_grid->node,nodes[1]);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0xc2,"ref_validation_boundary_face",(ulong)uVar4,"n1");
            return uVar4;
          }
          uVar4 = ref_node_location(ref_grid->node,nodes[2]);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0xc3,"ref_validation_boundary_face",(ulong)uVar4,"n2");
            unaff_R13D = uVar4;
          }
          bVar3 = 1;
          if (uVar4 != 0) {
            return unaff_R13D;
          }
        }
      }
      uVar7 = (ulong)(iVar6 + 1U);
    } while ((int)(iVar6 + 1U) < pRVar1->max);
  }
  pRVar1 = ref_grid->cell[6];
  if (0 < pRVar1->max) {
    iVar6 = 0;
    do {
      pRVar2 = pRVar1->c2n;
      if (pRVar2[(long)pRVar1->size_per * (long)iVar6] != -1) {
        lVar5 = 0;
        do {
          nodes[lVar5] = pRVar2[(long)pRVar1->size_per * (long)iVar6 + lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        uVar4 = ref_grid_cell_has_face(ref_grid,nodes,&has_face);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0xcb,"ref_validation_boundary_face",(ulong)uVar4,"has_face");
          return uVar4;
        }
        if (has_face == 0) {
          bVar3 = 1;
        }
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < pRVar1->max);
  }
  return (uint)bVar3;
}

Assistant:

REF_FCN REF_STATUS ref_validation_boundary_face(REF_GRID ref_grid) {
  REF_CELL ref_cell;
  REF_BOOL has_face;
  REF_INT cell;
  REF_INT node;
  REF_INT nodes[4];
  REF_BOOL problem;

  problem = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 3; node++)
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    nodes[3] = nodes[0];
    RSS(ref_grid_cell_has_face(ref_grid, nodes, &has_face), "has_face");
    if (!has_face) {
      problem = REF_TRUE;
      printf("triangle %d nodes %d %d %d global " REF_GLOB_FMT " " REF_GLOB_FMT
             " " REF_GLOB_FMT "\n",
             cell, nodes[0], nodes[1], nodes[2],
             ref_node_global(ref_grid_node(ref_grid), nodes[0]),
             ref_node_global(ref_grid_node(ref_grid), nodes[1]),
             ref_node_global(ref_grid_node(ref_grid), nodes[2]));
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[0]), "n0");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[1]), "n1");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[2]), "n2");
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 4; node++)
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    RSS(ref_grid_cell_has_face(ref_grid, nodes, &has_face), "has_face");
    if (!has_face) problem = REF_TRUE;
  }

  return (problem ? REF_FAILURE : REF_SUCCESS);
}